

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ssh_key * eddsa_new_pub(ssh_keyalg *alg,ptrlen data)

{
  ec_curve *curve_00;
  undefined8 *puVar1;
  EdwardsPoint *pEVar2;
  eddsa_key *ek;
  undefined1 local_68 [8];
  BinarySource src [1];
  ec_curve *curve;
  ecsign_extra *extra;
  ssh_keyalg *alg_local;
  ptrlen data_local;
  
  curve_00 = (ec_curve *)(**alg->extra)();
  if (curve_00->type == EC_EDWARDS) {
    BinarySource_INIT__((BinarySource *)local_68,data);
    BinarySource_get_string((BinarySource *)src[0]._24_8_);
    puVar1 = (undefined8 *)safemalloc(1,0x20,0);
    puVar1[3] = alg;
    *puVar1 = curve_00;
    puVar1[2] = 0;
    pEVar2 = BinarySource_get_epoint((BinarySource *)src[0]._24_8_,curve_00);
    puVar1[1] = pEVar2;
    if (puVar1[1] == 0) {
      eddsa_freekey((ssh_key *)(puVar1 + 3));
      data_local.len = 0;
    }
    else {
      data_local.len = (size_t)(puVar1 + 3);
    }
    return (ssh_key *)data_local.len;
  }
  __assert_fail("curve->type == EC_EDWARDS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x295,"ssh_key *eddsa_new_pub(const ssh_keyalg *, ptrlen)");
}

Assistant:

static ssh_key *eddsa_new_pub(const ssh_keyalg *alg, ptrlen data)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_EDWARDS);

    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, data);
    get_string(src);

    struct eddsa_key *ek = snew(struct eddsa_key);
    ek->sshk.vt = alg;
    ek->curve = curve;
    ek->privateKey = NULL;

    ek->publicKey = get_epoint(src, curve);
    if (!ek->publicKey) {
        eddsa_freekey(&ek->sshk);
        return NULL;
    }

    return &ek->sshk;
}